

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauProxy.cpp
# Opt level: O1

void __thiscall mau::DeliveryChannel::InsertQueueNode(DeliveryChannel *this,QueueNode *node)

{
  BufferAllocator *pBVar1;
  bool bVar2;
  uint32_t uVar3;
  DeliveryCommonData *pDVar4;
  uint64_t uVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  uint64_t uVar9;
  ulong uVar10;
  QueueNode *node_00;
  byte bVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined4 uVar15;
  undefined4 extraout_var;
  pthread_mutex_t *__mutex;
  undefined1 auVar16 [16];
  float fVar17;
  undefined1 in_ZMM0 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar21 [16];
  MauChannelConfig config;
  MauChannelConfig_t local_6c;
  
  auVar18 = in_ZMM1._0_16_;
  auVar16 = in_ZMM0._0_16_;
  LockedValue<MauChannelConfig_t>::Get(&local_6c,&this->Common->ChannelConfig);
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)&this->InsertLock);
  if (iVar7 != 0) goto LAB_0010f278;
  uVar9 = GetTimeUsec();
  uVar10 = uVar9 + local_6c.LightSpeedMsec * 1000;
  auVar16 = vcvtusi2ss_avx512f(auVar16,node->Bytes);
  auVar20._0_4_ = auVar16._0_4_ / local_6c.Router_MBPS;
  auVar20._4_12_ = auVar16._4_12_;
  uVar15 = vcvttss2usi_avx512f(auVar20);
  if (this->NextQueueSlotUsec < uVar10) {
    uVar9 = uVar10 + CONCAT44(extraout_var,uVar15);
    fVar17 = 0.0;
LAB_0010ee78:
    if (((local_6c.Router_RED_QueueFraction != 0.0) || (NAN(local_6c.Router_RED_QueueFraction))) &&
       (local_6c.Router_RED_QueueFraction < fVar17)) {
      uVar10 = (this->LossRNG).State;
      (this->LossRNG).State = uVar10 * 0x5851f42d4c957f2d + (this->LossRNG).Inc;
      uVar8 = (uint)(uVar10 >> 0x2d) ^ (uint)(uVar10 >> 0x1b);
      bVar6 = (byte)(uVar10 >> 0x3b);
      uVar12 = vcvttss2usi_avx512f(ZEXT416((uint)((((fVar17 - local_6c.Router_RED_QueueFraction) *
                                                   local_6c.Router_RED_MaxPLR) /
                                                  (1.0 - local_6c.Router_RED_QueueFraction)) *
                                                 4.2949673e+09)));
      if ((uVar8 >> bVar6 | uVar8 << 0x20 - bVar6) < uVar12) {
        pDVar4 = this->Common;
        __mutex = (pthread_mutex_t *)&pDVar4->ReadBufferAllocator;
        iVar7 = pthread_mutex_lock(__mutex);
        if (iVar7 != 0) {
          std::__throw_system_error(iVar7);
        }
        pktalloc::Allocator::Free(&(pDVar4->ReadBufferAllocator).Allocator,(uint8_t *)node);
        goto LAB_0010f196;
      }
    }
    uVar10 = (this->LossRNG).State;
    uVar5 = (this->LossRNG).Inc;
    uVar13 = uVar10 * 0x5851f42d4c957f2d + uVar5;
    (this->LossRNG).State = uVar13;
    uVar14 = uVar13 * 0x5851f42d4c957f2d + uVar5;
    auVar16 = vinsertps_avx(ZEXT416((uint)(this->InBurstReorder & 1) *
                                    (int)(1.0 - local_6c.OrderRate) +
                                    (uint)!(bool)(this->InBurstReorder & 1) *
                                    (int)local_6c.ReorderRate),ZEXT416((uint)local_6c.DuplicateRate)
                            ,0x10);
    (this->LossRNG).State = uVar14;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar10;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar13;
    auVar20 = vpunpcklqdq_avx(auVar21,auVar19);
    auVar18 = vpsrlvq_avx2(auVar20,_DAT_0011ab60);
    auVar19 = vpsrlvq_avx2(auVar20,_DAT_0011ab70);
    auVar18 = vpshufd_avx(auVar19 ^ auVar18,0xe8);
    auVar20 = vpsrlq_avx(auVar20,0x3b);
    auVar20 = vpshufd_avx(auVar20,0xe8);
    auVar20 = vprorvd_avx512vl(auVar18,auVar20);
    auVar18._8_4_ = 0x4f800000;
    auVar18._0_8_ = 0x4f8000004f800000;
    auVar18._12_4_ = 0x4f800000;
    auVar16 = vmulps_avx512vl(auVar16,auVar18);
    auVar16 = vcvttps2udq_avx512vl(auVar16);
    uVar10 = vpcmpud_avx512vl(auVar20,auVar16,1);
    bVar6 = (byte)uVar10 & 0xf;
    if ((uVar10 & 1) == 0) {
      this->InBurstReorder = false;
      local_6c.ReorderMinimumLatencyMsec = 0;
    }
    else {
      this->InBurstReorder = true;
      if (local_6c.ReorderMaximumLatencyMsec - local_6c.ReorderMinimumLatencyMsec != 0) {
        (this->LossRNG).State = uVar14 * 0x5851f42d4c957f2d + uVar5;
        uVar8 = (uint)(uVar14 >> 0x2d) ^ (uint)(uVar14 >> 0x1b);
        bVar11 = (byte)(uVar14 >> 0x3b);
        local_6c.ReorderMinimumLatencyMsec =
             local_6c.ReorderMinimumLatencyMsec +
             (uVar8 >> bVar11 | uVar8 << 0x20 - bVar11) %
             (local_6c.ReorderMaximumLatencyMsec - local_6c.ReorderMinimumLatencyMsec);
      }
    }
    bVar2 = this->InBurstLoss;
    uVar10 = (this->LossRNG).State;
    uVar13 = uVar10 * 0x5851f42d4c957f2d + uVar5;
    (this->LossRNG).State = uVar13;
    uVar12 = (uint)(uVar10 >> 0x2d) ^ (uint)(uVar10 >> 0x1b);
    bVar11 = (byte)(uVar10 >> 0x3b);
    uVar8 = vcvttss2usi_avx512f(ZEXT416((uint)((float)((uint)(bVar2 & 1) *
                                                       (int)(1.0 - local_6c.DeliveryRate) +
                                                      (uint)!(bool)(bVar2 & 1) *
                                                      (int)local_6c.LossRate) * 4.2949673e+09)));
    if ((uVar12 >> bVar11 | uVar12 << 0x20 - bVar11) < uVar8) {
      this->InBurstLoss = true;
      pDVar4 = this->Common;
      pBVar1 = &pDVar4->ReadBufferAllocator;
      iVar7 = pthread_mutex_lock((pthread_mutex_t *)pBVar1);
      if (iVar7 != 0) {
        std::__throw_system_error(iVar7);
      }
      pktalloc::Allocator::Free(&(pDVar4->ReadBufferAllocator).Allocator,(uint8_t *)node);
      bVar6 = bVar6 >> 1;
      pthread_mutex_unlock((pthread_mutex_t *)pBVar1);
      bVar2 = false;
    }
    else {
      this->InBurstLoss = false;
      uVar10 = uVar13 * 0x5851f42d4c957f2d + uVar5;
      (this->LossRNG).State = uVar10;
      uVar12 = (uint)(uVar13 >> 0x2d) ^ (uint)(uVar13 >> 0x1b);
      bVar11 = (byte)(uVar13 >> 0x3b);
      uVar8 = vcvttss2usi_avx512f(ZEXT416((uint)(local_6c.CorruptionRate * 4.2949673e+09)));
      if ((uVar12 >> bVar11 | uVar12 << 0x20 - bVar11) < uVar8) {
        (this->LossRNG).State = uVar10 * 0x5851f42d4c957f2d + uVar5;
        uVar8 = (uint)(uVar10 >> 0x2d) ^ (uint)(uVar10 >> 0x1b);
        bVar11 = (byte)(uVar10 >> 0x3b);
        node->Data[(ulong)(uVar8 >> bVar11 | uVar8 << 0x20 - bVar11) % (ulong)node->Bytes] =
             node->Data[(ulong)(uVar8 >> bVar11 | uVar8 << 0x20 - bVar11) % (ulong)node->Bytes] ^ 8;
      }
      if (local_6c.ReorderMinimumLatencyMsec == 0) {
        this->NextQueueSlotUsec = uVar9;
      }
      else {
        uVar9 = uVar9 + local_6c.ReorderMinimumLatencyMsec * 1000;
      }
      bVar6 = bVar6 >> 1;
      node->DeliveryUsec = uVar9;
      bVar2 = true;
    }
  }
  else {
    uVar9 = this->NextQueueSlotUsec + CONCAT44(extraout_var,uVar15);
    if (uVar9 < local_6c.Router_QueueMsec * 1000 + uVar10) {
      auVar20 = vcvtusi2ss_avx512f(auVar18,uVar9 - uVar10);
      auVar16 = vcvtusi2ss_avx512f(auVar18,local_6c.Router_QueueMsec * 1000);
      fVar17 = auVar20._0_4_ / auVar16._0_4_;
      goto LAB_0010ee78;
    }
    pDVar4 = this->Common;
    __mutex = (pthread_mutex_t *)&pDVar4->ReadBufferAllocator;
    iVar7 = pthread_mutex_lock(__mutex);
    if (iVar7 != 0) {
      std::__throw_system_error(iVar7);
    }
    pktalloc::Allocator::Free(&(pDVar4->ReadBufferAllocator).Allocator,(uint8_t *)node);
LAB_0010f196:
    pthread_mutex_unlock(__mutex);
    bVar2 = false;
    bVar6 = 0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->InsertLock);
  if (bVar2) {
    iVar7 = pthread_mutex_lock((pthread_mutex_t *)&this->QueueLock);
    if (iVar7 != 0) {
LAB_0010f278:
      std::__throw_system_error(iVar7);
    }
    PacketQueue::InsertSorted(&this->Queue,node);
    pthread_mutex_unlock((pthread_mutex_t *)&this->QueueLock);
    if ((bVar6 & 1) != 0) {
      pDVar4 = this->Common;
      pBVar1 = &pDVar4->ReadBufferAllocator;
      uVar3 = node->Bytes;
      iVar7 = pthread_mutex_lock((pthread_mutex_t *)pBVar1);
      if (iVar7 != 0) goto LAB_0010f278;
      node_00 = (QueueNode *)
                pktalloc::Allocator::Allocate(&(pDVar4->ReadBufferAllocator).Allocator,uVar3 + 0x1c)
      ;
      pthread_mutex_unlock((pthread_mutex_t *)pBVar1);
      node_00->Bytes = node->Bytes;
      memcpy(node_00->Data,node->Data,(ulong)node->Bytes);
      InsertQueueNode(this,node_00);
    }
    postNextTimer(this);
  }
  return;
}

Assistant:

void DeliveryChannel::InsertQueueNode(QueueNode* node)
{
    /*
        Client <-> Internet Delay <-> ISP Router Queue <-> Server

        Most queues are going to be on the receiver ISP side, for example
        on the cellphone network or cable ISP.  The Internet transmission
        delay comes before that.  Since this is the most common case for
        the protocols we are testing, we use the simplified model above.

        In this model, packets put into the queue are subjected to:
        (1) Internet Delay
        (2) ISP Router Queue

        The Internet Delay may vary on route changes.

        The Internet Service Provider (ISP) Router Queue causes
        delays and packet loss if the queue is too full.
    */

    MauChannelConfig config = Common->ChannelConfig.Get();
    bool dupe = false;

    // Hold InsertLock while processing insert
    {
        Locker locker(InsertLock);

        const uint64_t nowUsec = GetTimeUsec();

        const unsigned routerQueueUsec = config.Router_QueueMsec * 1000;
        const uint64_t routerQueueStartUsec = nowUsec + config.LightSpeedMsec * 1000;
        const unsigned dataDelayUsec = (unsigned)(node->Bytes / config.Router_MBPS);

        uint64_t deliveryUsec = 0;
        float queueFraction = 0.f;

        // Calculate delivery time based on router queue
        if (NextQueueSlotUsec < routerQueueStartUsec) {
            deliveryUsec = routerQueueStartUsec + dataDelayUsec;
        }
        else {
            deliveryUsec = NextQueueSlotUsec + dataDelayUsec;

            // DropTail if packet does not fit in router queue
            if (deliveryUsec >= routerQueueStartUsec + routerQueueUsec) {
                Common->ReadBufferAllocator.Free(node);
                return;
            }

            queueFraction = (deliveryUsec - routerQueueStartUsec) / (float)routerQueueUsec;
        }

        // If RED is triggered:
        if (config.Router_RED_QueueFraction != 0.f && queueFraction > config.Router_RED_QueueFraction)
        {
            // Rescale:
            const float red_plr = config.Router_RED_MaxPLR * (queueFraction - config.Router_RED_QueueFraction) / (1.f - config.Router_RED_QueueFraction);

            // If RED drop is needed:
            if (LossRNG.Next() < (uint32_t)(0xffffffff * red_plr)) {
                Common->ReadBufferAllocator.Free(node);
                return;
            }
        }

        // If duplicating:
        if (LossRNG.Next() < (uint32_t)(0xffffffff * config.DuplicateRate)) {
            dupe = true;
        }

        float reorderRate;
        if (InBurstReorder) {
            reorderRate = 1.f - config.OrderRate;
        }
        else {
            reorderRate = config.ReorderRate;
        }

        // If this packet will be reordered:
        unsigned reorderMsec = 0;
        if (LossRNG.Next() < (uint32_t)(0xffffffff * reorderRate))
        {
            InBurstReorder = true;
            reorderMsec = config.ReorderMinimumLatencyMsec;
            const unsigned range = config.ReorderMaximumLatencyMsec - config.ReorderMinimumLatencyMsec;
            if (range > 0) {
                reorderMsec += LossRNG.Next() % range;
            }
        }
        else {
            InBurstReorder = false;
        }

        // Select loss rate for this packet due to Gilbert-Elliott channel model
        float lossRate;
        if (InBurstLoss) {
            lossRate = 1.f - config.DeliveryRate;
        }
        else {
            lossRate = config.LossRate;
        }

        // If this packet will be lost:
        if (LossRNG.Next() < (uint32_t)(0xffffffff * lossRate)) {
            InBurstLoss = true;
            Common->ReadBufferAllocator.Free(node);
            return;
        }
        InBurstLoss = false; // Burst loss is done

        // If this packet will be corrupted:
        if (LossRNG.Next() < (uint32_t)(0xffffffff * config.CorruptionRate)) {
            node->Data[LossRNG.Next() % node->Bytes] ^= 8;
        }

        // If re-ordered:
        if (reorderMsec > 0) {
            // Add reorder time to it
            // Note: Bypasses queue so will not be counted towards channel bandwidth
            deliveryUsec += reorderMsec * 1000;
        }
        else {
            // It takes up a queue slot, so advance the queue
            NextQueueSlotUsec = deliveryUsec;
        }

        node->DeliveryUsec = deliveryUsec;
    }

    // Hold QueueLock during queue insert
    {
        Locker locker(QueueLock);
        Queue.InsertSorted(node);
    }

    if (dupe)
    {
        // Allocate space for the duplicate
        uint8_t* readBuffer = Common->ReadBufferAllocator.Allocate(kQueueHeaderSize + node->Bytes);

        QueueNode* dupeNode = reinterpret_cast<QueueNode*>(readBuffer);

        // Copy the data
        dupeNode->Bytes = node->Bytes;
        memcpy(&dupeNode->Data[0], &node->Data[0], node->Bytes);

        InsertQueueNode(dupeNode);
    }

    postNextTimer();
}